

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O2

string * duckdb::PragmaShowTables_abi_cxx11_(void)

{
  string *in_RDI;
  allocator local_9;
  
  ::std::__cxx11::string::string
            ((string *)in_RDI,
             "\n\twith \"tables\" as\n\t(\n\t\tSELECT table_name as \"name\"\n\t\tFROM duckdb_tables\n\t\twhere in_search_path(database_name, schema_name)\n\t), \"views\" as\n\t(\n\t\tSELECT view_name as \"name\"\n\t\tFROM duckdb_views\n\t\twhere in_search_path(database_name, schema_name)\n\t), db_objects as\n\t(\n\t\tSELECT \"name\" FROM \"tables\"\n\t\tUNION ALL\n\t\tSELECT \"name\" FROM \"views\"\n\t)\n\tSELECT \"name\"\n\tFROM db_objects\n\tORDER BY \"name\";"
             ,&local_9);
  return in_RDI;
}

Assistant:

string PragmaShowTables() {
	// clang-format off
	return R"EOF(
	with "tables" as
	(
		SELECT table_name as "name"
		FROM duckdb_tables
		where in_search_path(database_name, schema_name)
	), "views" as
	(
		SELECT view_name as "name"
		FROM duckdb_views
		where in_search_path(database_name, schema_name)
	), db_objects as
	(
		SELECT "name" FROM "tables"
		UNION ALL
		SELECT "name" FROM "views"
	)
	SELECT "name"
	FROM db_objects
	ORDER BY "name";)EOF";
	// clang-format on
}